

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_utils.cpp
# Opt level: O3

u8 tg::getNumChannels(u32 format)

{
  if ((int)format < 0x80e0) {
    if (format == 0x1903) {
      return '\x01';
    }
    if (format == 0x1907) {
      return '\x03';
    }
    if (format == 0x1908) {
      return '\x04';
    }
  }
  else {
    if (format == 0x80e0) {
      return '\x03';
    }
    if (format == 0x80e1) {
      return '\x04';
    }
    if (format == 0x8227) {
      return '\x02';
    }
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tg/texture_utils.cpp"
                ,0x1d4,"u8 tg::getNumChannels(u32)");
}

Assistant:

u8 getNumChannels(u32 format)
{
    switch(format)
    {
    case GL_RED:
        return 1;
    case GL_RG:
        return 2;
    case GL_RGB:
    case GL_BGR:
            return 3;
    case GL_RGBA:
    case GL_BGRA:
        return 4;
    // There are many more but I'm lazy
    }
    assert(false);
    return 0;
}